

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O2

void __thiscall
tonk::gateway::StateMachine::BeginGatewayXMLRequest(StateMachine *this,int gatewayIndex)

{
  ParsedURL *this_00;
  ostringstream *this_01;
  AsioHost *request_00;
  ostream *poVar1;
  undefined8 *puVar2;
  OutputWorker *this_02;
  pointer pcVar3;
  Result result;
  shared_ptr<tonk::gateway::HTTPRequester> requester;
  string request;
  ParsedURL url;
  ostringstream oss;
  undefined1 local_440 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_430;
  _Any_data local_428;
  code *pcStack_418;
  code *apcStack_410 [2];
  _Alloc_hider local_400;
  HTTPCallback local_3f8;
  undefined1 local_3d8 [64];
  string local_398 [104];
  ostringstream local_330 [376];
  undefined1 local_1b8 [392];
  
  pcVar3 = (pointer)((long)gatewayIndex * 200);
  *(int *)(pcVar3 + (long)&((this->GatewayEndpoints).
                            super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                            ._M_impl.super__Vector_impl_data._M_start)->RetriesRemaining) =
       *(int *)(pcVar3 + (long)&((this->GatewayEndpoints).
                                 super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->RetriesRemaining) + -1;
  MakeSharedNoThrow<tonk::gateway::HTTPRequester>();
  if ((ParsedURL *)local_440._8_8_ != (ParsedURL *)0x0) {
    ParsedURL::ParsedURL
              ((ParsedURL *)local_3d8,
               (ParsedURL *)
               (pcVar3 + (long)(this->GatewayEndpoints).
                               super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                               ._M_impl.super__Vector_impl_data._M_start));
    std::__cxx11::ostringstream::ostringstream(local_330);
    poVar1 = std::operator<<((ostream *)local_330,"GET /");
    poVar1 = std::operator<<(poVar1,(string *)(local_3d8 + 0x20));
    std::operator<<(poVar1," HTTP/1.1\r\n");
    poVar1 = std::operator<<((ostream *)local_330,"Host: ");
    poVar1 = std::operator<<(poVar1,local_398);
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_398._32_2_);
    std::operator<<(poVar1,"\r\n");
    std::operator<<((ostream *)local_330,
                    "Accept: text/html,application/xhtml+xml,application/xml\r\n\r\n");
    std::__cxx11::stringbuf::str();
    request_00 = this->Host;
    this_00 = (ParsedURL *)(local_1b8 + 0x10);
    local_400._M_p = pcVar3;
    local_1b8._0_8_ = this;
    local_1b8._8_4_ = gatewayIndex;
    ParsedURL::ParsedURL(this_00,(ParsedURL *)local_3d8);
    local_428._M_unused._M_object = (void *)0x0;
    local_428._8_8_ = (pointer)0x0;
    pcStack_418 = (code *)0x0;
    apcStack_410[0] = (code *)0x0;
    puVar2 = (undefined8 *)operator_new(0xb8);
    *(undefined4 *)(puVar2 + 1) = local_1b8._8_4_;
    *puVar2 = local_1b8._0_8_;
    ParsedURL::ParsedURL((ParsedURL *)(puVar2 + 2),this_00);
    apcStack_410[0] =
         std::
         _Function_handler<void_(const_tonk::Result_&,_unsigned_int,_const_char_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1071:9)>
         ::_M_invoke;
    pcStack_418 = std::
                  _Function_handler<void_(const_tonk::Result_&,_unsigned_int,_const_char_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1071:9)>
                  ::_M_manager;
    local_428._M_unused._M_object = puVar2;
    HTTPRequester::Begin
              ((HTTPRequester *)local_440,(ParsedURL *)local_440._8_8_,(AsioHost *)local_3d8,
               (string *)request_00,&local_3f8);
    std::_Function_base::~_Function_base((_Function_base *)&local_428);
    ParsedURL::~ParsedURL(this_00);
    if ((ErrorResult *)local_440._0_8_ == (ErrorResult *)0x0) {
      std::__shared_ptr<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2> *)
                 (local_400._M_p +
                 (long)&((this->GatewayEndpoints).
                         super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                         ._M_impl.super__Vector_impl_data._M_start)->Requester),
                 (__shared_ptr<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2> *)
                 (local_440 + 8));
    }
    else {
      Result::ToJson_abi_cxx11_((string *)&local_428,(Result *)local_440);
      if (DAT_0019e060 < 5) {
        this_01 = (ostringstream *)(local_1b8 + 0x10);
        local_1b8._0_8_ = ModuleLogger;
        local_1b8._8_4_ = Error;
        std::__cxx11::ostringstream::ostringstream(this_01);
        std::operator<<((ostream *)this_01,(string *)&DAT_0019e090);
        std::operator<<((ostream *)this_01,"Failed to start web request: ");
        std::operator<<((ostream *)this_01,(string *)local_428._M_pod_data);
        this_02 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_02,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(this_01);
      }
      std::__cxx11::string::~string((string *)local_428._M_pod_data);
    }
    Result::~Result((Result *)local_440);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::ostringstream::~ostringstream(local_330);
    ParsedURL::~ParsedURL((ParsedURL *)local_3d8);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_430);
  return;
}

Assistant:

void StateMachine::BeginGatewayXMLRequest(int gatewayIndex)
{
    // Decrement retry count
    GatewayEndpoints[gatewayIndex].RetriesRemaining--;

    std::shared_ptr<HTTPRequester> requester = MakeSharedNoThrow<HTTPRequester>();
    if (!requester) {
        return;
    }

    ParsedURL url = GatewayEndpoints[gatewayIndex].URL;

    std::ostringstream oss;
    oss << "GET /" << url.XMLPath << " HTTP/1.1\r\n";
    oss << "Host: " << url.IP << ":" << url.Port << "\r\n";
    oss << "Accept: text/html,application/xhtml+xml,application/xml\r\n\r\n";
    std::string request = oss.str();

    Result result = requester->Begin(
        url,
        Host,
        request,
        [this, gatewayIndex, url](
            const Result& result,
            unsigned code,
            const char* response,
            unsigned bytes)
    {
        if (result.IsFail()) {
            ModuleLogger.Error("Request for XML description failed: ", result.ToJson());
            return;
        }

        // Stop trying if we got a response
        this->GatewayEndpoints[gatewayIndex].RetriesRemaining = 0;

        // Request is now considered completed
        this->GatewayEndpoints[gatewayIndex].Completed = true;

        // If HTTP response code was not 200 OK:
        if (code != 200) {
            ModuleLogger.Error("Request for XML description failed. Server returned error code: ", code);
            return;
        }

        // Parse XML response
        ParsedXML xml;
        Result parseResult = xml.Parse(response, bytes);
        if (parseResult.IsFail()) {
            ModuleLogger.Error("Failed to parse XML: ", parseResult.ToJson());
            return;
        }

        // Handle response
        this->OnXMLResponse(url, xml);
    });

    if (result.IsFail()) {
        ModuleLogger.Error("Failed to start web request: ", result.ToJson());
        return;
    }

    GatewayEndpoints[gatewayIndex].Requester = requester;
}